

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

void __thiscall sptk::Matrix::Resize(Matrix *this,int num_row,int num_column)

{
  int iVar1;
  pointer __s;
  pointer pdVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (num_row < 1) {
    num_row = 0;
  }
  iVar3 = 0;
  if (0 < num_column) {
    iVar3 = num_column;
  }
  this->num_row_ = num_row;
  this->num_column_ = iVar3;
  std::vector<double,_std::allocator<double>_>::resize(&this->data_,(ulong)(uint)(num_row * iVar3));
  std::vector<double_*,_std::allocator<double_*>_>::resize(&this->index_,(long)this->num_row_);
  __s = (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar2 = (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar2) {
    memset(__s,0,((long)pdVar2 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  iVar3 = this->num_row_;
  if (0 < (long)iVar3) {
    iVar1 = this->num_column_;
    lVar4 = 0;
    lVar5 = 0;
    do {
      (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5] =
           (double *)
           ((long)(this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar4);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + (long)iVar1 * 8;
    } while (iVar3 != lVar5);
  }
  return;
}

Assistant:

void Matrix::Resize(int num_row, int num_column) {
  num_row_ = num_row < 0 ? 0 : num_row;
  num_column_ = num_column < 0 ? 0 : num_column;
  data_.resize(num_row_ * num_column_);
  index_.resize(num_row_);

  Fill(0.0);
  for (int i(0); i < num_row_; ++i) {
    index_[i] = &data_[i * num_column_];
  }
}